

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLSLangUtils.cpp
# Opt level: O0

spv_target_env
Diligent::GLSLangUtils::anon_unknown_4::SpirvVersionToSpvTargetEnv(SpirvVersion Version)

{
  Char *Message;
  undefined1 local_30 [8];
  string msg;
  SpirvVersion Version_local;
  
  switch(Version) {
  case Vk100:
    msg.field_2._12_4_ = 1;
    break;
  case Vk110:
    msg.field_2._12_4_ = 0x12;
    break;
  case Vk110_Spirv14:
    msg.field_2._12_4_ = 0x15;
    break;
  case Vk120:
    msg.field_2._12_4_ = 0x17;
    break;
  case GL:
    msg.field_2._12_4_ = 9;
    break;
  case GLES:
    msg.field_2._12_4_ = 9;
    break;
  default:
    msg.field_2._8_4_ = Version;
    FormatString<char[22]>((string *)local_30,(char (*) [22])"Unknown SPIRV version");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"SpirvVersionToSpvTargetEnv",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/GLSLangUtils.cpp"
               ,0x1a5);
    std::__cxx11::string::~string((string *)local_30);
    msg.field_2._12_4_ = 1;
  }
  return msg.field_2._12_4_;
}

Assistant:

spv_target_env SpirvVersionToSpvTargetEnv(SpirvVersion Version)
{
    static_assert(static_cast<int>(SpirvVersion::Count) == 6, "Did you add a new member to SpirvVersion? You may need to handle it here.");
    switch (Version)
    {
        // clang-format off
        case SpirvVersion::Vk100:         return SPV_ENV_VULKAN_1_0;
        case SpirvVersion::Vk110:         return SPV_ENV_VULKAN_1_1;
        case SpirvVersion::Vk110_Spirv14: return SPV_ENV_VULKAN_1_1_SPIRV_1_4;
        case SpirvVersion::Vk120:         return SPV_ENV_VULKAN_1_2;
        case SpirvVersion::GL:            return SPV_ENV_OPENGL_4_5;
        case SpirvVersion::GLES:          return SPV_ENV_OPENGL_4_5;
        // clang-format on
        default:
            UNEXPECTED("Unknown SPIRV version");
            return SPV_ENV_VULKAN_1_0;
    }
}